

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t c4::base64_decode(c4 *param_1,char *param_2,size_t param_3,ulong param_4)

{
  c4 cVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  csubstr encoded;
  
  encoded.len = param_3;
  encoded.str = param_2;
  bVar3 = base64_valid(param_1,encoded);
  if (!bVar3) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      sVar4 = (*pcVar2)();
      return sVar4;
    }
    handle_error(0x20a4ad,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x45ef,"base64_valid(encoded)");
  }
  if (((ulong)param_2 & 3) != 0) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      sVar4 = (*pcVar2)();
      return sVar4;
    }
    handle_error(0x20a4ad,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x45f0,"encoded.len % 4 == 0");
  }
  uVar6 = 1;
  pcVar9 = (char *)0x0;
  do {
    uVar7 = uVar6 - 1;
    if (param_2 <= pcVar9) {
LAB_001c3814:
      if (param_2 != pcVar9) {
        cVar1 = (param_1 + 2)[(long)pcVar9];
        if (cVar1 == (c4)0x3d) {
          if (param_2 + -4 != pcVar9) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              sVar4 = (*pcVar2)();
              return sVar4;
            }
            handle_error(0x20a4ad,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x460a,"d + 4 == encoded.str + encoded.len");
          }
          if ((param_1 + 3)[(long)pcVar9] != (c4)0x3d) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              sVar4 = (*pcVar2)();
              return sVar4;
            }
            handle_error(0x20a4ad,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x460b,"d[3] == \'=\'");
          }
          if ((char)(param_1 + 1)[(long)pcVar9] < '\0') {
            if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              sVar4 = (*pcVar2)();
              return sVar4;
            }
            handle_error(0x20a4ad,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x460d,"d[1] >= 0");
          }
          if ((char)param_1[(long)pcVar9] < '\0') {
            if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              sVar4 = (*pcVar2)();
              return sVar4;
            }
            handle_error(0x20a4ad,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x460e,"d[0] >= 0");
          }
          bVar3 = uVar7 < param_4;
          uVar7 = uVar6;
          if (bVar3) {
            *(byte *)((param_3 - 1) + uVar6) =
                 (byte)(((uint)(byte)(&detail::base64_char_to_sextet_)[(char)param_1[(long)pcVar9]]
                        << 0x12) >> 0x10) |
                 (byte)((uint)((int)(char)(&detail::base64_char_to_sextet_)
                                          [(char)(param_1 + 1)[(long)pcVar9]] << 0xc) >> 0x10);
          }
        }
        else if ((param_1 + 3)[(long)pcVar9] == (c4)0x3d) {
          if (param_2 + -4 != pcVar9) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              sVar4 = (*pcVar2)();
              return sVar4;
            }
            handle_error(0x20a4ad,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x4613,"d + 4 == encoded.str + encoded.len");
          }
          if ((char)cVar1 < '\0') {
            if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              sVar4 = (*pcVar2)();
              return sVar4;
            }
            handle_error(0x20a4ad,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x4615,"d[2] >= 0");
          }
          if ((char)(param_1 + 1)[(long)pcVar9] < '\0') {
            if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              sVar4 = (*pcVar2)();
              return sVar4;
            }
            handle_error(0x20a4ad,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x4616,"d[1] >= 0");
          }
          if ((char)param_1[(long)pcVar9] < '\0') {
            if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              sVar4 = (*pcVar2)();
              return sVar4;
            }
            handle_error(0x20a4ad,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x4617,"d[0] >= 0");
          }
          uVar5 = (int)(char)(&detail::base64_char_to_sextet_)[(char)(param_1 + 1)[(long)pcVar9]] <<
                  0xc | (int)(char)(&detail::base64_char_to_sextet_)[(char)cVar1] << 6;
          if (uVar7 < param_4) {
            *(byte *)((param_3 - 1) + uVar6) =
                 (byte)(((uint)(byte)(&detail::base64_char_to_sextet_)[(char)param_1[(long)pcVar9]]
                        << 0x12) >> 0x10) | (byte)(uVar5 >> 0x10);
          }
          if (uVar6 < param_4) {
            *(char *)(param_3 + uVar6) = (char)(uVar5 >> 8);
          }
          uVar7 = uVar6 + 1;
        }
      }
      return uVar7;
    }
    if (((param_1 + 2)[(long)pcVar9] == (c4)0x3d) ||
       (cVar1 = (param_1 + 3)[(long)pcVar9], cVar1 == (c4)0x3d)) {
      if (param_2 + -4 != pcVar9) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          sVar4 = (*pcVar2)();
          return sVar4;
        }
        handle_error(0x20a4ad,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x45f9,"d + 4 == encoded.str + encoded.len");
      }
      goto LAB_001c3814;
    }
    if ((char)cVar1 < '\0') {
      if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        sVar4 = (*pcVar2)();
        return sVar4;
      }
      handle_error(0x20a4ad,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x45fd,"d[3] >= 0");
    }
    if ((char)(param_1 + 2)[(long)pcVar9] < '\0') {
      if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        sVar4 = (*pcVar2)();
        return sVar4;
      }
      handle_error(0x20a4ad,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x45fe,"d[2] >= 0");
    }
    if ((char)(param_1 + 1)[(long)pcVar9] < '\0') {
      if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        sVar4 = (*pcVar2)();
        return sVar4;
      }
      handle_error(0x20a4ad,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x45ff,"d[1] >= 0");
    }
    if ((char)param_1[(long)pcVar9] < '\0') {
      if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        sVar4 = (*pcVar2)();
        return sVar4;
      }
      handle_error(0x20a4ad,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x4600,"d[0] >= 0");
    }
    uVar8 = (int)(char)(&detail::base64_char_to_sextet_)[(char)(param_1 + 2)[(long)pcVar9]] << 6 |
            (int)(char)(&detail::base64_char_to_sextet_)[(char)cVar1];
    uVar5 = (int)(char)(&detail::base64_char_to_sextet_)[(char)(param_1 + 1)[(long)pcVar9]] << 0xc |
            uVar8;
    if (uVar7 < param_4) {
      *(byte *)((param_3 - 1) + uVar6) =
           (byte)(((uint)(byte)(&detail::base64_char_to_sextet_)[(char)param_1[(long)pcVar9]] <<
                  0x12) >> 0x10) | (byte)(uVar5 >> 0x10);
    }
    if (uVar6 < param_4) {
      *(char *)(param_3 + uVar6) = (char)(uVar5 >> 8);
    }
    if (uVar6 + 1 < param_4) {
      *(char *)(param_3 + 1 + uVar6) = (char)uVar8;
    }
    pcVar9 = pcVar9 + 4;
    uVar6 = uVar6 + 3;
  } while( true );
}

Assistant:

size_t base64_decode(csubstr encoded, blob data)
{
    #define c4append_(c) { if(wpos < data.len) { data.buf[wpos] = static_cast<c4::byte>(c); } ++wpos; }
    #define c4appendval_(c, shift)\
    {\
        C4_XASSERT(c >= 0);\
        C4_XASSERT(size_t(c) < sizeof(detail::base64_char_to_sextet_));\
        val |= static_cast<uint32_t>(detail::base64_char_to_sextet_[(c)]) << ((shift) * 6);\
    }

    C4_ASSERT(base64_valid(encoded));
    C4_CHECK(encoded.len % 4 == 0);
    size_t wpos = 0;  // the write position
    const char *C4_RESTRICT d = encoded.str;
    constexpr const uint32_t full_byte = 0xff;
    // process every quartet of input 6 bits --> triplet of output bytes
    for(size_t rpos = 0; rpos < encoded.len; rpos += 4, d += 4)
    {
        if(d[2] == '=' || d[3] == '=') // skip the last quartet if it is padded
        {
            C4_ASSERT(d + 4 == encoded.str + encoded.len);
            break;
        }
        uint32_t val = 0;
        c4appendval_(d[3], 0);
        c4appendval_(d[2], 1);
        c4appendval_(d[1], 2);
        c4appendval_(d[0], 3);
        c4append_((val >> (2 * 8)) & full_byte);
        c4append_((val >> (1 * 8)) & full_byte);
        c4append_((val           ) & full_byte);
    }
    // deal with the last quartet when it is padded
    if(d == encoded.str + encoded.len)
        return wpos;
    if(d[2] == '=') // 2 padding chars
    {
        C4_ASSERT(d + 4 == encoded.str + encoded.len);
        C4_ASSERT(d[3] == '=');
        uint32_t val = 0;
        c4appendval_(d[1], 2);
        c4appendval_(d[0], 3);
        c4append_((val >> (2 * 8)) & full_byte);
    }
    else if(d[3] == '=') // 1 padding char
    {
        C4_ASSERT(d + 4 == encoded.str + encoded.len);
        uint32_t val = 0;
        c4appendval_(d[2], 1);
        c4appendval_(d[1], 2);
        c4appendval_(d[0], 3);
        c4append_((val >> (2 * 8)) & full_byte);
        c4append_((val >> (1 * 8)) & full_byte);
    }
    return wpos;
    #undef c4append_
    #undef c4appendval_
}